

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O2

void * ShrinkUnits(CPpmd8 *p,void *oldPtr,uint oldNU,uint newNU)

{
  Byte *pBVar1;
  byte bVar2;
  uint newIndx;
  long lVar3;
  ulong uVar4;
  
  bVar2 = p->Units2Indx[oldNU - 1];
  if (bVar2 != p->Units2Indx[newNU - 1]) {
    newIndx = (uint)p->Units2Indx[newNU - 1];
    uVar4 = (ulong)p->FreeList[newIndx];
    if (uVar4 == 0) {
      SplitBlock(p,oldPtr,(uint)bVar2,newIndx);
    }
    else {
      pBVar1 = p->Base + uVar4;
      p->FreeList[newIndx] = *(CPpmd_Void_Ref *)(p->Base + uVar4 + 4);
      p->Stamps[newIndx] = p->Stamps[newIndx] - 1;
      lVar3 = 0;
      do {
        *(undefined4 *)(pBVar1 + lVar3) = *(undefined4 *)((long)oldPtr + lVar3);
        *(undefined4 *)(pBVar1 + lVar3 + 4) = *(undefined4 *)((long)oldPtr + lVar3 + 4);
        *(undefined4 *)(pBVar1 + lVar3 + 8) = *(undefined4 *)((long)oldPtr + lVar3 + 8);
        lVar3 = lVar3 + 0xc;
        newNU = newNU - 1;
      } while (newNU != 0);
      InsertNode(p,oldPtr,(uint)bVar2);
      oldPtr = pBVar1;
    }
  }
  return (Byte *)oldPtr;
}

Assistant:

static void *ShrinkUnits(CPpmd8 *p, void *oldPtr, unsigned oldNU, unsigned newNU)
{
  unsigned i0 = U2I(oldNU);
  unsigned i1 = U2I(newNU);
  if (i0 == i1)
    return oldPtr;
  if (p->FreeList[i1] != 0)
  {
    void *ptr = RemoveNode(p, i1);
    MyMem12Cpy(ptr, oldPtr, newNU);
    InsertNode(p, oldPtr, i0);
    return ptr;
  }
  SplitBlock(p, oldPtr, i0, i1);
  return oldPtr;
}